

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O3

bool __thiscall QDockWidgetLayout::nativeWindowDeco(QDockWidgetLayout *this)

{
  byte bVar1;
  bool bVar2;
  QWidget *pQVar3;
  QDockWidgetGroupWindow *this_00;
  QDockAreaLayoutInfo *pQVar4;
  byte bVar5;
  
  pQVar3 = QLayout::parentWidget(&this->super_QLayout);
  bVar1 = (byte)(pQVar3->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i;
  QLayout::parentWidget(&this->super_QLayout);
  this_00 = (QDockWidgetGroupWindow *)
            QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
  bVar5 = this_00 != (QDockWidgetGroupWindow *)0x0 | bVar1;
  if (((bVar1 & 1) == 0) && (this_00 != (QDockWidgetGroupWindow *)0x0)) {
    pQVar4 = QDockWidgetGroupWindow::tabLayoutInfo(this_00);
    bVar5 = pQVar4 != (QDockAreaLayoutInfo *)0x0;
  }
  bVar2 = wmSupportsNativeWindowDeco();
  if ((bVar2 & bVar5) == 1) {
    bVar2 = (this->item_list).d.ptr[3] == (QLayoutItem *)0x0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QDockWidgetLayout::nativeWindowDeco() const
{
    bool floating = parentWidget()->isWindow();
#if QT_CONFIG(tabbar)
    if (auto groupWindow =
            qobject_cast<const QDockWidgetGroupWindow *>(parentWidget()->parentWidget()))
        floating = floating || groupWindow->tabLayoutInfo();
#endif
    return nativeWindowDeco(floating);
}